

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cc
# Opt level: O2

void __thiscall raptor::Connection::Connection(Connection *this,INotificationTransfer *service)

{
  this->_service = service;
  this->_proto = (IProtocol *)0x0;
  this->_fd = -1;
  this->_cid = 0xffffffffffffffff;
  this->_rcv_thd = (SendRecvThread *)0x0;
  this->_snd_thd = (SendRecvThread *)0x0;
  (this->_rcv_buffer)._vs.super__Vector_base<raptor::Slice,_std::allocator<raptor::Slice>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_rcv_buffer)._vs.super__Vector_base<raptor::Slice,_std::allocator<raptor::Slice>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_rcv_buffer)._vs.super__Vector_base<raptor::Slice,_std::allocator<raptor::Slice>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_rcv_buffer)._length = 0;
  (this->_snd_buffer)._vs.super__Vector_base<raptor::Slice,_std::allocator<raptor::Slice>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_snd_buffer)._vs.super__Vector_base<raptor::Slice,_std::allocator<raptor::Slice>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_snd_buffer)._vs.super__Vector_base<raptor::Slice,_std::allocator<raptor::Slice>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_snd_buffer)._length = 0;
  Mutex::Mutex(&this->_rcv_mutex);
  Mutex::Mutex(&this->_snd_mutex);
  Slice::Slice(&this->_addr_str);
  this->_user_data = 0;
  this->_extend_ptr = (void *)0x0;
  return;
}

Assistant:

Connection::Connection(internal::INotificationTransfer* service)
    : _service(service)
    , _proto(nullptr)
    , _fd(-1)
    , _cid(core::InvalidConnectionId)
    , _rcv_thd(nullptr)
    , _snd_thd(nullptr) {

    _user_data = 0;
    _extend_ptr = nullptr;
}